

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O0

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  long lVar46;
  long lVar47;
  long lVar48;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  float *pfVar49;
  long lVar50;
  long *in_RDI;
  __m128 _sum;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  float *r2;
  float *r1;
  float *r0;
  int i_1;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  Mat img0;
  float *outptr0;
  int q;
  float *k0;
  float bias0;
  Mat out0;
  int p;
  int remain_outch_start;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  __m256 s0123;
  __m256 s23;
  __m256 s01;
  __m256 v3;
  __m128 x32;
  __m128 x64;
  float local_f2c;
  int local_d64;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  int local_d44;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  float *local_bc0;
  int local_bb4;
  undefined8 *local_b68;
  int local_b08;
  int local_b00;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  int local_304;
  float *local_300;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_160;
  float fStack_15c;
  
  lVar46 = in_RDI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar47 = in_RSI[6];
  lVar48 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_b00 = 0; local_b00 < (int)lVar48; local_b00 = local_b00 + 1) {
    iVar3 = *(int *)((long)in_RSI + 0x34);
    pfVar49 = (float *)(*in_RSI + in_RSI[8] * (long)local_b00 * in_RSI[2]);
    local_b08 = (int)(((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] * in_RSI[2] + 0xfU
                      & 0xfffffffffffffff0) / (ulong)in_RSI[2]);
    if ((int)in_RSI[5] == 4) {
      local_b08 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    }
    if (lVar4 == 0) {
      local_f2c = 0.0;
    }
    else {
      local_f2c = *(float *)(lVar4 + (long)local_b00 * 4);
    }
    local_300 = pfVar49;
    for (local_304 = 0; local_304 < local_b08 * iVar3; local_304 = local_304 + 1) {
      *local_300 = local_f2c;
      local_300 = local_300 + 1;
    }
    local_b68 = (undefined8 *)(*in_RDX + in_RDX[8] * (long)local_b00 * in_RDX[2]);
    for (local_bb4 = 0; local_bb4 < (int)lVar46; local_bb4 = local_bb4 + 1) {
      iVar3 = *(int *)((long)in_RDI + 0x2c);
      lVar50 = *in_RDI + in_RDI[8] * (long)local_bb4 * in_RDI[2];
      lVar5 = in_RDI[2];
      uVar10 = *local_b68;
      uVar11 = local_b68[1];
      uVar12 = local_b68[2];
      uVar13 = local_b68[3];
      uVar14 = local_b68[4];
      uVar15 = local_b68[5];
      uVar16 = local_b68[6];
      uVar17 = local_b68[7];
      uVar18 = local_b68[8];
      uVar19 = local_b68[9];
      uVar20 = local_b68[10];
      uVar21 = local_b68[0xb];
      uVar22 = local_b68[0xc];
      uVar23 = local_b68[0xd];
      uVar24 = local_b68[0xe];
      uVar25 = local_b68[0xf];
      uVar26 = local_b68[0x10];
      uVar27 = local_b68[0x11];
      uVar28 = local_b68[0x12];
      uVar29 = local_b68[0x13];
      uVar30 = local_b68[0x14];
      uVar31 = local_b68[0x15];
      uVar32 = local_b68[0x16];
      uVar33 = local_b68[0x17];
      uVar34 = local_b68[0x18];
      uVar35 = local_b68[0x19];
      uVar36 = local_b68[0x1a];
      uVar37 = local_b68[0x1b];
      uVar38 = local_b68[0x1c];
      uVar39 = local_b68[0x1d];
      uVar40 = local_b68[0x1e];
      uVar41 = local_b68[0x1f];
      auVar1 = *(undefined1 (*) [32])(local_b68 + 0x20);
      local_bc0 = pfVar49;
      for (local_d44 = 0; local_d44 < (int)lVar47; local_d44 = local_d44 + 1) {
        local_d50 = (undefined8 *)(lVar50 + (long)iVar3 * (long)local_d44 * lVar5);
        local_d58 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_d44 + 1) * lVar5);
        local_d60 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_d44 + 2) * lVar5);
        for (local_d64 = 0; local_d64 < iVar2; local_d64 = local_d64 + 1) {
          local_340 = (float)uVar10;
          fStack_33c = (float)((ulong)uVar10 >> 0x20);
          fStack_338 = (float)uVar11;
          fStack_334 = (float)((ulong)uVar11 >> 0x20);
          fStack_330 = (float)uVar12;
          fStack_32c = (float)((ulong)uVar12 >> 0x20);
          fStack_328 = (float)uVar13;
          fStack_324 = (float)((ulong)uVar13 >> 0x20);
          local_360 = (float)*local_d50;
          fStack_35c = (float)((ulong)*local_d50 >> 0x20);
          fStack_358 = (float)local_d50[1];
          fStack_354 = (float)((ulong)local_d50[1] >> 0x20);
          fStack_350 = (float)local_d50[2];
          fStack_34c = (float)((ulong)local_d50[2] >> 0x20);
          fStack_348 = (float)local_d50[3];
          local_380 = (float)uVar14;
          fStack_37c = (float)((ulong)uVar14 >> 0x20);
          fStack_378 = (float)uVar15;
          fStack_374 = (float)((ulong)uVar15 >> 0x20);
          fStack_370 = (float)uVar16;
          fStack_36c = (float)((ulong)uVar16 >> 0x20);
          fStack_368 = (float)uVar17;
          fStack_364 = (float)((ulong)uVar17 >> 0x20);
          local_3a0 = (float)local_d50[4];
          fStack_39c = (float)((ulong)local_d50[4] >> 0x20);
          fStack_398 = (float)local_d50[5];
          fStack_394 = (float)((ulong)local_d50[5] >> 0x20);
          fStack_390 = (float)local_d50[6];
          fStack_38c = (float)((ulong)local_d50[6] >> 0x20);
          fStack_388 = (float)local_d50[7];
          local_3c0 = (float)uVar18;
          fStack_3bc = (float)((ulong)uVar18 >> 0x20);
          fStack_3b8 = (float)uVar19;
          fStack_3b4 = (float)((ulong)uVar19 >> 0x20);
          fStack_3b0 = (float)uVar20;
          fStack_3ac = (float)((ulong)uVar20 >> 0x20);
          fStack_3a8 = (float)uVar21;
          fStack_3a4 = (float)((ulong)uVar21 >> 0x20);
          local_3e0 = (float)local_d50[8];
          fStack_3dc = (float)((ulong)local_d50[8] >> 0x20);
          fStack_3d8 = (float)local_d50[9];
          fStack_3d4 = (float)((ulong)local_d50[9] >> 0x20);
          fStack_3d0 = (float)local_d50[10];
          fStack_3cc = (float)((ulong)local_d50[10] >> 0x20);
          fStack_3c8 = (float)local_d50[0xb];
          local_ca0 = (float)uVar22;
          fStack_c9c = (float)((ulong)uVar22 >> 0x20);
          fStack_c98 = (float)uVar23;
          fStack_c94 = (float)((ulong)uVar23 >> 0x20);
          fStack_c90 = (float)uVar24;
          fStack_c8c = (float)((ulong)uVar24 >> 0x20);
          fStack_c88 = (float)uVar25;
          fStack_c84 = (float)((ulong)uVar25 >> 0x20);
          local_560 = (float)*local_d58;
          fStack_55c = (float)((ulong)*local_d58 >> 0x20);
          fStack_558 = (float)local_d58[1];
          fStack_554 = (float)((ulong)local_d58[1] >> 0x20);
          fStack_550 = (float)local_d58[2];
          fStack_54c = (float)((ulong)local_d58[2] >> 0x20);
          fStack_548 = (float)local_d58[3];
          local_cc0 = (float)uVar26;
          fStack_cbc = (float)((ulong)uVar26 >> 0x20);
          fStack_cb8 = (float)uVar27;
          fStack_cb4 = (float)((ulong)uVar27 >> 0x20);
          fStack_cb0 = (float)uVar28;
          fStack_cac = (float)((ulong)uVar28 >> 0x20);
          fStack_ca8 = (float)uVar29;
          fStack_ca4 = (float)((ulong)uVar29 >> 0x20);
          local_520 = (float)local_d58[4];
          fStack_51c = (float)((ulong)local_d58[4] >> 0x20);
          fStack_518 = (float)local_d58[5];
          fStack_514 = (float)((ulong)local_d58[5] >> 0x20);
          fStack_510 = (float)local_d58[6];
          fStack_50c = (float)((ulong)local_d58[6] >> 0x20);
          fStack_508 = (float)local_d58[7];
          local_ce0 = (float)uVar30;
          fStack_cdc = (float)((ulong)uVar30 >> 0x20);
          fStack_cd8 = (float)uVar31;
          fStack_cd4 = (float)((ulong)uVar31 >> 0x20);
          fStack_cd0 = (float)uVar32;
          fStack_ccc = (float)((ulong)uVar32 >> 0x20);
          fStack_cc8 = (float)uVar33;
          fStack_cc4 = (float)((ulong)uVar33 >> 0x20);
          local_4e0 = (float)local_d58[8];
          fStack_4dc = (float)((ulong)local_d58[8] >> 0x20);
          fStack_4d8 = (float)local_d58[9];
          fStack_4d4 = (float)((ulong)local_d58[9] >> 0x20);
          fStack_4d0 = (float)local_d58[10];
          fStack_4cc = (float)((ulong)local_d58[10] >> 0x20);
          fStack_4c8 = (float)local_d58[0xb];
          local_d00 = (float)uVar34;
          fStack_cfc = (float)((ulong)uVar34 >> 0x20);
          fStack_cf8 = (float)uVar35;
          fStack_cf4 = (float)((ulong)uVar35 >> 0x20);
          fStack_cf0 = (float)uVar36;
          fStack_cec = (float)((ulong)uVar36 >> 0x20);
          fStack_ce8 = (float)uVar37;
          fStack_ce4 = (float)((ulong)uVar37 >> 0x20);
          local_4a0 = (float)*local_d60;
          fStack_49c = (float)((ulong)*local_d60 >> 0x20);
          fStack_498 = (float)local_d60[1];
          fStack_494 = (float)((ulong)local_d60[1] >> 0x20);
          fStack_490 = (float)local_d60[2];
          fStack_48c = (float)((ulong)local_d60[2] >> 0x20);
          fStack_488 = (float)local_d60[3];
          local_d20 = (float)uVar38;
          fStack_d1c = (float)((ulong)uVar38 >> 0x20);
          fStack_d18 = (float)uVar39;
          fStack_d14 = (float)((ulong)uVar39 >> 0x20);
          fStack_d10 = (float)uVar40;
          fStack_d0c = (float)((ulong)uVar40 >> 0x20);
          fStack_d08 = (float)uVar41;
          fStack_d04 = (float)((ulong)uVar41 >> 0x20);
          local_460 = (float)local_d60[4];
          fStack_45c = (float)((ulong)local_d60[4] >> 0x20);
          fStack_458 = (float)local_d60[5];
          fStack_454 = (float)((ulong)local_d60[5] >> 0x20);
          fStack_450 = (float)local_d60[6];
          fStack_44c = (float)((ulong)local_d60[6] >> 0x20);
          fStack_448 = (float)local_d60[7];
          local_d40 = auVar1._0_4_;
          fStack_d3c = auVar1._4_4_;
          fStack_d38 = auVar1._8_4_;
          fStack_d34 = auVar1._12_4_;
          fStack_d30 = auVar1._16_4_;
          fStack_d2c = auVar1._20_4_;
          fStack_d28 = auVar1._24_4_;
          fStack_d24 = auVar1._28_4_;
          local_420 = (float)local_d60[8];
          fStack_41c = (float)((ulong)local_d60[8] >> 0x20);
          fStack_418 = (float)local_d60[9];
          fStack_414 = (float)((ulong)local_d60[9] >> 0x20);
          fStack_410 = (float)local_d60[10];
          fStack_40c = (float)((ulong)local_d60[10] >> 0x20);
          fStack_408 = (float)local_d60[0xb];
          auVar8 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
          uStack_1f0 = auVar9._0_8_;
          uStack_1e8 = auVar9._8_8_;
          auVar45._4_4_ =
               fStack_cfc * fStack_49c + fStack_c9c * fStack_55c + fStack_33c * fStack_35c;
          auVar45._0_4_ = local_d00 * local_4a0 + local_ca0 * local_560 + local_340 * local_360;
          auVar45._8_4_ =
               fStack_cf8 * fStack_498 + fStack_c98 * fStack_558 + fStack_338 * fStack_358;
          auVar45._12_4_ =
               fStack_cf4 * fStack_494 + fStack_c94 * fStack_554 + fStack_334 * fStack_354;
          auVar45._16_4_ =
               fStack_cf0 * fStack_490 + fStack_c90 * fStack_550 + fStack_330 * fStack_350;
          auVar45._20_4_ =
               fStack_cec * fStack_48c + fStack_c8c * fStack_54c + fStack_32c * fStack_34c;
          auVar45._24_4_ =
               fStack_ce8 * fStack_488 + fStack_c88 * fStack_548 + fStack_328 * fStack_348;
          auVar45._28_4_ = fStack_ce4 + fStack_c84 + fStack_324;
          auVar6._4_4_ = fStack_d1c * fStack_45c + fStack_cbc * fStack_51c + fStack_37c * fStack_39c
          ;
          auVar6._0_4_ = local_d20 * local_460 + local_cc0 * local_520 + local_380 * local_3a0;
          auVar6._8_4_ = fStack_d18 * fStack_458 + fStack_cb8 * fStack_518 + fStack_378 * fStack_398
          ;
          auVar6._12_4_ =
               fStack_d14 * fStack_454 + fStack_cb4 * fStack_514 + fStack_374 * fStack_394;
          auVar6._16_4_ =
               fStack_d10 * fStack_450 + fStack_cb0 * fStack_510 + fStack_370 * fStack_390;
          auVar6._20_4_ =
               fStack_d0c * fStack_44c + fStack_cac * fStack_50c + fStack_36c * fStack_38c;
          auVar6._24_4_ =
               fStack_d08 * fStack_448 + fStack_ca8 * fStack_508 + fStack_368 * fStack_388;
          auVar6._28_4_ = fStack_d04 + fStack_ca4 + fStack_364;
          auVar6 = vhaddps_avx(auVar45,auVar6);
          auVar44._4_4_ =
               fStack_d3c * fStack_41c + fStack_cdc * fStack_4dc + fStack_3bc * fStack_3dc;
          auVar44._0_4_ = local_d40 * local_420 + local_ce0 * local_4e0 + local_3c0 * local_3e0;
          auVar44._8_4_ =
               fStack_d38 * fStack_418 + fStack_cd8 * fStack_4d8 + fStack_3b8 * fStack_3d8;
          auVar44._12_4_ =
               fStack_d34 * fStack_414 + fStack_cd4 * fStack_4d4 + fStack_3b4 * fStack_3d4;
          auVar44._16_4_ =
               fStack_d30 * fStack_410 + fStack_cd0 * fStack_4d0 + fStack_3b0 * fStack_3d0;
          auVar44._20_4_ =
               fStack_d2c * fStack_40c + fStack_ccc * fStack_4cc + fStack_3ac * fStack_3cc;
          auVar44._24_4_ =
               fStack_d28 * fStack_408 + fStack_cc8 * fStack_4c8 + fStack_3a8 * fStack_3c8;
          auVar44._28_4_ = fStack_d24 + fStack_cc4 + fStack_3a4;
          auVar7._16_8_ = uStack_1f0;
          auVar7._0_16_ = auVar8;
          auVar7._24_8_ = uStack_1e8;
          auVar7 = vhaddps_avx(auVar44,auVar7);
          auVar6 = vhaddps_avx(auVar6,auVar7);
          local_220 = auVar6._16_4_;
          fStack_21c = auVar6._20_4_;
          fStack_218 = auVar6._24_4_;
          fStack_214 = auVar6._28_4_;
          local_230 = auVar6._0_4_;
          fStack_22c = auVar6._4_4_;
          fStack_228 = auVar6._8_4_;
          fStack_224 = auVar6._12_4_;
          uVar42 = CONCAT44(fStack_21c + fStack_22c,local_220 + local_230);
          uVar43 = CONCAT44(fStack_214 + fStack_224,fStack_218 + fStack_228);
          auVar9._8_8_ = uVar43;
          auVar9._0_8_ = uVar42;
          auVar8._8_8_ = uVar43;
          auVar8._0_8_ = uVar42;
          auVar8 = vunpckhpd_avx(auVar8,auVar9);
          local_160 = auVar8._0_4_;
          fStack_15c = auVar8._4_4_;
          *local_bc0 = local_220 + local_230 + local_160 + fStack_21c + fStack_22c + fStack_15c +
                       *local_bc0;
          local_bc0 = local_bc0 + 1;
          local_d50 = local_d50 + 4;
          local_d58 = local_d58 + 4;
          local_d60 = local_d60 + 4;
        }
      }
      local_b68 = local_b68 + 0x24;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}